

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Internal.h
# Opt level: O3

string * __thiscall
chatra::formatTextV_abi_cxx11_
          (string *__return_storage_ptr__,chatra *this,char *format,__va_list_tag *args)

{
  int iVar1;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  undefined8 uStack_58;
  va_list args2;
  vector<char,_std::allocator<char>_> buffer;
  
  args2[0].overflow_arg_area = *(void **)(format + 0x10);
  uStack_58 = *(undefined8 *)format;
  args2[0]._0_8_ = *(undefined8 *)(format + 8);
  iVar1 = vsnprintf((char *)0x0,0,(char *)this,format);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (iVar1 < 0) {
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x1ce584);
  }
  else {
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)&args2[0].reg_save_area,(ulong)(iVar1 + 1),
               (allocator_type *)local_78);
    vsnprintf((char *)args2[0].reg_save_area,
              (long)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start - (long)args2[0].reg_save_area,(char *)this,
              &uStack_58);
    std::__cxx11::string::string
              ((string *)local_78,(char *)args2[0].reg_save_area,
               (allocator *)
               ((long)&buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_78);
    if (local_78[0] != local_68) {
      operator_delete(local_78[0]);
    }
    if (args2[0].reg_save_area != (void *)0x0) {
      operator_delete(args2[0].reg_save_area);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string formatTextV(const char *format, va_list args) {
	va_list args2;
	va_copy(args2, args);
	auto length = std::vsnprintf(nullptr, 0, format, args);
	std::string ret;
	if (length < 0)
		ret = "(error)";
	else {
		std::vector<char> buffer(static_cast<size_t>(length) + 1);
		std::vsnprintf(buffer.data(), buffer.size(), format, args2);
		ret = std::string(buffer.data());
	}
	va_end(args2);
	return ret;
}